

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_getimage.c
# Opt level: O1

void putRGBcontig8bittile
               (TIFFRGBAImage *img,uint32_t *cp,uint32_t x,uint32_t y,uint32_t w,uint32_t h,
               int32_t fromskew,int32_t toskew,uchar *pp)

{
  ulong uVar1;
  uint32_t uVar2;
  
  if (h != 0) {
    uVar1 = (ulong)img->samplesperpixel;
    do {
      uVar2 = w;
      if (7 < w) {
        do {
          *cp = *(uint3 *)pp | 0xff000000;
          cp[1] = CONCAT12(*(undefined1 *)((long)pp + uVar1 + 2),*(undefined2 *)((long)pp + uVar1))
                  | 0xff000000;
          cp[2] = CONCAT12(*(undefined1 *)((long)pp + uVar1 * 2 + 2),
                           *(undefined2 *)((long)pp + uVar1 * 2)) | 0xff000000;
          cp[3] = CONCAT12(*(undefined1 *)((long)pp + uVar1 * 3 + 2),
                           *(undefined2 *)((long)pp + uVar1 * 3)) | 0xff000000;
          cp[4] = CONCAT12(*(undefined1 *)((long)pp + uVar1 * 4 + 2),
                           (short)*(uint3 *)((long)pp + uVar1 * 4)) | 0xff000000;
          cp[5] = CONCAT12(*(undefined1 *)((long)pp + uVar1 * 5 + 2),
                           *(undefined2 *)((long)pp + uVar1 * 5)) | 0xff000000;
          cp[6] = CONCAT12(*(undefined1 *)((long)pp + uVar1 * 6 + 2),
                           *(undefined2 *)((long)pp + uVar1 * 6)) | 0xff000000;
          cp[7] = CONCAT12(*(undefined1 *)((long)pp + uVar1 * 7 + 2),
                           *(undefined2 *)((long)pp + uVar1 * 7)) | 0xff000000;
          cp = cp + 8;
          pp = (uchar *)((long)pp + uVar1 * 2 * 4);
          uVar2 = uVar2 - 8;
        } while (7 < uVar2);
      }
      switch(uVar2) {
      case 7:
        *cp = *(uint3 *)pp | 0xff000000;
        cp = cp + 1;
        pp = (uchar *)((long)pp + uVar1);
      case 6:
        *cp = *(uint3 *)pp | 0xff000000;
        cp = cp + 1;
        pp = (uchar *)((long)pp + uVar1);
      case 5:
        *cp = *(uint3 *)pp | 0xff000000;
        cp = cp + 1;
        pp = (uchar *)((long)pp + uVar1);
      case 4:
        *cp = *(uint3 *)pp | 0xff000000;
        cp = cp + 1;
        pp = (uchar *)((long)pp + uVar1);
      case 3:
        *cp = *(uint3 *)pp | 0xff000000;
        cp = cp + 1;
        pp = (uchar *)((long)pp + uVar1);
      case 2:
        *cp = *(uint3 *)pp | 0xff000000;
        cp = cp + 1;
        pp = (uchar *)((long)pp + uVar1);
      case 1:
        *cp = *(uint3 *)pp | 0xff000000;
        cp = cp + 1;
        pp = (uchar *)((long)pp + uVar1);
      }
      pp = (uchar *)((long)pp + (long)fromskew * uVar1);
      cp = cp + toskew;
      h = h - 1;
    } while (h != 0);
  }
  return;
}

Assistant:

DECLAREContigPutFunc(putRGBcontig8bittile)
{
    int samplesperpixel = img->samplesperpixel;

    (void)x;
    (void)y;
    fromskew *= samplesperpixel;
    for (; h > 0; --h)
    {
        UNROLL8(w, NOP, *cp++ = PACK(pp[0], pp[1], pp[2]);
                pp += samplesperpixel);
        cp += toskew;
        pp += fromskew;
    }
}